

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condvar.c
# Opt level: O3

void nn_condvar_term(nn_condvar_t *cond)

{
  int iVar1;
  
  iVar1 = pthread_cond_destroy((pthread_cond_t *)cond);
  if (iVar1 == 0) {
    return;
  }
  nn_condvar_term_cold_1();
}

Assistant:

void nn_condvar_term (nn_condvar_t *cond)
{
    int rc;

    /* This should never fail, the system is allowed to return EBUSY if
       there are outstanding waiters (a serious bug!), or EINVAL if the
       cv is somehow invalid or illegal.  Either of these cases would
       represent a serious programming defect in our caller. */
    rc = pthread_cond_destroy (&cond->cv);
    errnum_assert (rc == 0, rc);
}